

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::BinaryEventExpressionSyntax::setChild
          (BinaryEventExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  Token TVar2;
  ConstTokenOrSyntax *in_stack_ffffffffffffff98;
  EventExpressionSyntax *local_60;
  EventExpressionSyntax *local_40;
  not_null<slang::syntax::EventExpressionSyntax_*> local_38;
  undefined8 local_30;
  Info *local_28;
  EventExpressionSyntax *local_20;
  not_null<slang::syntax::EventExpressionSyntax_*> local_18 [3];
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x77682f);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_60 = (EventExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x77683f);
      local_60 = SyntaxNode::as<slang::syntax::EventExpressionSyntax>(pSVar1);
    }
    local_20 = local_60;
    not_null<slang::syntax::EventExpressionSyntax_*>::
    not_null<slang::syntax::EventExpressionSyntax_*>(local_18,&local_20);
    *(EventExpressionSyntax **)(in_RDI + 0x18) = local_18[0].ptr;
  }
  else if (in_RSI == 1) {
    TVar2 = ConstTokenOrSyntax::token(in_stack_ffffffffffffff98);
    local_30 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x20) = local_30;
    local_28 = TVar2.info;
    *(Info **)(in_RDI + 0x28) = local_28;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x7768bd);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_40 = (EventExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x7768cd);
      local_40 = SyntaxNode::as<slang::syntax::EventExpressionSyntax>(pSVar1);
    }
    not_null<slang::syntax::EventExpressionSyntax_*>::
    not_null<slang::syntax::EventExpressionSyntax_*>(&local_38,&local_40);
    *(EventExpressionSyntax **)(in_RDI + 0x30) = local_38.ptr;
  }
  return;
}

Assistant:

void BinaryEventExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: left = child.node() ? &child.node()->as<EventExpressionSyntax>() : nullptr; return;
        case 1: operatorToken = child.token(); return;
        case 2: right = child.node() ? &child.node()->as<EventExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}